

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexTriangleFilter.cpp
# Opt level: O0

void __thiscall
Ptex::v2_2::PtexTriangleFilter::splitAndApply
          (PtexTriangleFilter *this,PtexTriangleKernel *k,int faceid,FaceInfo *f)

{
  int iVar1;
  FaceInfo *in_RCX;
  long in_RSI;
  PtexTriangleKernel *in_RDI;
  PtexTriangleKernel ka_2;
  PtexTriangleKernel ka_1;
  PtexTriangleKernel ka;
  PtexTriangleKernel *in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff5c;
  FaceInfo *in_stack_ffffffffffffff60;
  PtexTriangleKernel *in_stack_ffffffffffffff68;
  PtexTriangleFilter *in_stack_ffffffffffffff70;
  
  if (*(float *)(in_RSI + 0xc) <= 0.0 && *(float *)(in_RSI + 0xc) != 0.0) {
    iVar1 = FaceInfo::adjface(in_RCX,2);
    if (-1 < iVar1) {
      PtexTriangleKernel::PtexTriangleKernel((PtexTriangleKernel *)0x844094);
      PtexTriangleKernel::splitU(in_stack_ffffffffffffff50,in_RDI);
      applyAcrossEdge(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                      in_stack_ffffffffffffff5c);
    }
  }
  if (*(float *)(in_RSI + 0x10) <= 0.0 && *(float *)(in_RSI + 0x10) != 0.0) {
    iVar1 = FaceInfo::adjface(in_RCX,0);
    if (-1 < iVar1) {
      PtexTriangleKernel::PtexTriangleKernel((PtexTriangleKernel *)0x8440f0);
      PtexTriangleKernel::splitV(in_stack_ffffffffffffff50,in_RDI);
      applyAcrossEdge(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                      in_stack_ffffffffffffff5c);
    }
  }
  if (*(float *)(in_RSI + 0x14) <= 0.0 && *(float *)(in_RSI + 0x14) != 0.0) {
    iVar1 = FaceInfo::adjface(in_RCX,1);
    if (-1 < iVar1) {
      PtexTriangleKernel::PtexTriangleKernel((PtexTriangleKernel *)0x84414c);
      PtexTriangleKernel::splitW(in_stack_ffffffffffffff50,in_RDI);
      applyAcrossEdge(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                      in_stack_ffffffffffffff5c);
    }
  }
  apply((PtexTriangleFilter *)ka_2._24_8_,(PtexTriangleKernel *)ka_2._16_8_,(int)ka_2.u1,
        (FaceInfo *)ka_2._0_8_);
  return;
}

Assistant:

void PtexTriangleFilter::splitAndApply(PtexTriangleKernel& k, int faceid, const Ptex::FaceInfo& f)
{
    // do we need to split? if so, split kernel and apply across edge(s)
    if (k.u1 < 0 && f.adjface(2) >= 0) {
        PtexTriangleKernel ka;
        k.splitU(ka);
        applyAcrossEdge(ka, f, 2);
    }
    if (k.v1 < 0 && f.adjface(0) >= 0) {
        PtexTriangleKernel ka;
        k.splitV(ka);
        applyAcrossEdge(ka, f, 0);
    }
    if (k.w1 < 0 && f.adjface(1) >= 0) {
        PtexTriangleKernel ka;
        k.splitW(ka);
        applyAcrossEdge(ka, f, 1);
    }
    // apply to local face
    apply(k, faceid, f);
}